

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::RemoveLast(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  CppStringType CVar3;
  RepeatedField<int> *this_00;
  RepeatedField<unsigned_long> *this_01;
  MapFieldBase *this_02;
  RepeatedPtrFieldBase *pRVar4;
  RepeatedField<long> *this_03;
  RepeatedField<unsigned_int> *this_04;
  RepeatedField<bool> *this_05;
  RepeatedField<double> *this_06;
  RepeatedField<float> *this_07;
  RepeatedField<absl::lts_20250127::Cord> *this_08;
  char *description;
  Descriptor *pDVar5;
  Metadata MVar6;
  
  MVar6 = Message::GetMetadata(message);
  if (MVar6.reflection != this) {
    pDVar5 = this->descriptor_;
    MVar6 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,MVar6.descriptor,field,"RemoveLast");
  }
  pDVar5 = this->descriptor_;
  if (field->containing_type_ == pDVar5) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      if ((field->field_0x1 & 8) != 0) {
        uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        internal::ExtensionSet::RemoveLast
                  ((ExtensionSet *)
                   ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                   field->number_);
        return;
      }
      switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
      case 1:
      case 8:
        this_00 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
        RepeatedField<int>::RemoveLast(this_00);
        return;
      case 2:
        this_03 = MutableRaw<google::protobuf::RepeatedField<long>>(this,message,field);
        RepeatedField<long>::RemoveLast(this_03);
        return;
      case 3:
        this_04 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
        RepeatedField<unsigned_int>::RemoveLast(this_04);
        return;
      case 4:
        this_01 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
        RepeatedField<unsigned_long>::RemoveLast(this_01);
        return;
      case 5:
        this_06 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message,field);
        RepeatedField<double>::RemoveLast(this_06);
        return;
      case 6:
        this_07 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message,field);
        RepeatedField<float>::RemoveLast(this_07);
        return;
      case 7:
        this_05 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
        RepeatedField<bool>::RemoveLast(this_05);
        return;
      case 9:
        CVar3 = FieldDescriptor::cpp_string_type(field);
        if ((CVar3 == kView) || (CVar3 == kString)) {
          pRVar4 = &MutableRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                              (this,message,field)->super_RepeatedPtrFieldBase;
          internal::RepeatedPtrFieldBase::
          RemoveLast<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(pRVar4);
          return;
        }
        if (CVar3 == kCord) {
          this_08 = MutableRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                              (this,message,field);
          RepeatedField<absl::lts_20250127::Cord>::RemoveLast(this_08);
          return;
        }
        break;
      case 10:
        bVar1 = FieldDescriptor::is_map(field);
        if (bVar1) {
          this_02 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
          pRVar4 = internal::MapFieldBase::MutableRepeatedField(this_02);
        }
        else {
          pRVar4 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
        }
        internal::RepeatedPtrFieldBase::
        RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                  (pRVar4);
        return;
      }
      return;
    }
    pDVar5 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar5,field,"RemoveLast",description);
}

Assistant:

void Reflection::RemoveLast(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(RemoveLast, message);
  USAGE_CHECK_MESSAGE_TYPE(RemoveLast);
  USAGE_CHECK_REPEATED(RemoveLast);

  if (field->is_extension()) {
    MutableExtensionSet(message)->RemoveLast(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                             \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->RemoveLast(); \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->cpp_string_type()) {
          case FieldDescriptor::CppStringType::kCord:
            MutableRaw<RepeatedField<absl::Cord>>(message, field)->RemoveLast();
            break;
          case FieldDescriptor::CppStringType::kView:
          case FieldDescriptor::CppStringType::kString:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)
                ->RemoveLast();
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->RemoveLast<GenericTypeHandler<Message> >();
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->RemoveLast<GenericTypeHandler<Message> >();
        }
        break;
    }
  }
}